

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O2

bool __thiscall Turn::removeTurn(Turn *this,NurseSolution *nurseSolution)

{
  bool bVar1;
  __normal_iterator<NurseSolution_**,_std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>_>
  __position;
  NurseSolution *local_20;
  
  local_20 = nurseSolution;
  bVar1 = hasNurse(this,nurseSolution);
  if ((bVar1) && (bVar1 = NurseSolution::hasTurn(nurseSolution,this), bVar1)) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution*const>>
                           ((this->nurses).
                            super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (this->nurses).
                            super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&local_20);
    std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::erase
              (&this->nurses,(const_iterator)__position._M_current);
    NurseSolution::removeTurn(local_20,this);
    return true;
  }
  return false;
}

Assistant:

const bool Turn::removeTurn(NurseSolution *nurseSolution) {
    if (!hasNurse(nurseSolution) || !nurseSolution->hasTurn(this))
        return false;

    nurses.erase(find(begin(nurses), end(nurses), nurseSolution));
    nurseSolution->removeTurn(this);

    return true;
}